

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl_font_x.cxx
# Opt level: O0

Fl_Font_Descriptor * find(int fnum,int size)

{
  char *name_00;
  Fl_Font_Descriptor *this;
  Fl_Font_Descriptor *local_30;
  Fl_Font_Descriptor *f;
  Fl_Fontdesc *s;
  char *name;
  int size_local;
  int fnum_local;
  
  f = (Fl_Font_Descriptor *)(fl_fonts + fnum);
  if (((Fl_Fontdesc *)f)->name == (char *)0x0) {
    f = (Fl_Font_Descriptor *)fl_fonts;
  }
  local_30 = *(Fl_Font_Descriptor **)(f[1].glok + 0xc);
  while( true ) {
    if (local_30 == (Fl_Font_Descriptor *)0x0) {
      fl_open_display();
      name_00 = put_font_size((char *)f->next,size);
      this = (Fl_Font_Descriptor *)operator_new(0x60);
      Fl_Font_Descriptor::Fl_Font_Descriptor(this,name_00);
      this->size = size;
      this->next = *(Fl_Font_Descriptor **)(f[1].glok + 0xc);
      *(Fl_Font_Descriptor **)(f[1].glok + 0xc) = this;
      free(name_00);
      return this;
    }
    if (local_30->size == size) break;
    local_30 = local_30->next;
  }
  return local_30;
}

Assistant:

static Fl_Font_Descriptor* find(int fnum, int size) {
  char *name;
  Fl_Fontdesc* s = fl_fonts+fnum;
  if (!s->name) s = fl_fonts; // use font 0 if still undefined
  Fl_Font_Descriptor* f;
  for (f = s->first; f; f = f->next)
    if (f->size == size) return f;
  fl_open_display();

  name = put_font_size(s->name, size);
  f = new Fl_Font_Descriptor(name);
  f->size = size;
  f->next = s->first;
  s->first = f;
  free(name);
  return f;
}